

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEditPrivate::ensureCursorVisible(QPlainTextEditPrivate *this,bool center)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QPlainTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar5;
  int x;
  bool rtl;
  QPlainTextEdit *q;
  QRect cr;
  QRect visible;
  QRect *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff94;
  QTextCursor local_30 [8];
  undefined1 *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QVar5 = QWidget::rect((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  stack0xffffffffffffffe0 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  _local_28 = QPlainTextEdit::cursorRect
                        ((QPlainTextEdit *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar3 = QRect::top((QRect *)0x6c39f6);
  iVar4 = QRect::top((QRect *)0x6c3a07);
  if (iVar3 < iVar4) {
LAB_006c3a36:
    QWidgetTextControl::textCursor
              ((QWidgetTextControl *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QTextCursor::position();
    ensureVisible(QVar5._0_8_,local_28._12_4_,local_28._11_1_,local_28._10_1_);
    QTextCursor::~QTextCursor(local_30);
  }
  else {
    in_stack_ffffffffffffff94 = QRect::bottom((QRect *)0x6c3a1b);
    iVar3 = QRect::bottom((QRect *)0x6c3a2c);
    if (iVar3 < in_stack_ffffffffffffff94) goto LAB_006c3a36;
  }
  bVar2 = QWidget::isRightToLeft((QWidget *)0x6c3a81);
  iVar3 = QRect::left((QRect *)0x6c3a91);
  iVar4 = QRect::left((QRect *)0x6c3aa2);
  if (iVar4 <= iVar3) {
    in_stack_ffffffffffffff8c = QRect::right((QRect *)0x6c3ab6);
    iVar4 = QRect::right((QRect *)0x6c3ac7);
    if (in_stack_ffffffffffffff8c <= iVar4) goto LAB_006c3b72;
  }
  QRect::center((QRect *)CONCAT44(in_stack_ffffffffffffff94,iVar3));
  QPoint::x((QPoint *)0x6c3aee);
  horizontalOffset((QPlainTextEditPrivate *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  QRect::width(in_stack_ffffffffffffff68);
  iVar3 = (int)((ulong)(in_RDI->super_QAbstractScrollAreaPrivate).hbar >> 0x20);
  if (bVar2) {
    QAbstractSlider::maximum
              ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  QAbstractSlider::setValue
            ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),iVar3)
  ;
LAB_006c3b72:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextEditPrivate::ensureCursorVisible(bool center)
{
    Q_Q(QPlainTextEdit);
    QRect visible = viewport->rect();
    QRect cr = q->cursorRect();
    if (cr.top() < visible.top() || cr.bottom() > visible.bottom()) {
        ensureVisible(control->textCursor().position(), center);
    }

    const bool rtl = q->isRightToLeft();
    if (cr.left() < visible.left() || cr.right() > visible.right()) {
        int x = cr.center().x() + horizontalOffset() - visible.width()/2;
        hbar->setValue(rtl ? hbar->maximum() - x : x);
    }
}